

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O2

BigNumber * __thiscall
BigNumber::multiply(BigNumber *__return_storage_ptr__,BigNumber *this,BigNumber *other)

{
  bool bVar1;
  uint __val;
  uint uVar2;
  string *psVar3;
  string *psVar4;
  int iVar5;
  long lVar6;
  size_type sVar7;
  uint i;
  ulong uVar8;
  int local_1f4;
  string rr;
  BigNumber b1;
  string local_1b0;
  BigNumber b2;
  BigNumber local_170;
  BigNumber local_150;
  BigNumber local_130;
  BigNumber local_110;
  BigNumber local_f0;
  BigNumber local_d0;
  string local_b0 [32];
  BigNumber local_90;
  string local_70;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)other);
  bVar1 = operator>((BigNumber *)local_50,this);
  psVar4 = (string *)this;
  if (bVar1) {
    psVar4 = (string *)other;
  }
  std::__cxx11::string::string((string *)&b1,psVar4);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string((string *)&local_d0,(string *)other);
  bVar1 = operator>(&local_d0,this);
  if (bVar1) {
    other = this;
  }
  std::__cxx11::string::string((string *)&b2,(string *)other);
  std::__cxx11::string::~string((string *)&local_d0);
  if (*b1._numberString._M_dataplus._M_p == '-') {
    if (*b2._numberString._M_dataplus._M_p != '-') {
      negate((BigNumber *)&local_1b0,&b1);
      std::__cxx11::string::string((string *)&local_110,(string *)&b2);
      multiply((BigNumber *)&rr,(BigNumber *)&local_1b0,&local_110);
      negate(__return_storage_ptr__,(BigNumber *)&rr);
      std::__cxx11::string::~string((string *)&rr);
      psVar4 = (string *)&local_110;
      goto LAB_00103657;
    }
    negate((BigNumber *)&rr,&b1);
    negate(&local_f0,&b2);
    multiply(__return_storage_ptr__,(BigNumber *)&rr,&local_f0);
    psVar4 = (string *)&local_f0;
LAB_00103590:
    std::__cxx11::string::~string(psVar4);
    psVar3 = &rr;
  }
  else {
    if (*b2._numberString._M_dataplus._M_p != '-') {
      std::__cxx11::string::string((string *)&local_170,(string *)&b1);
      rr._M_dataplus._M_p = (pointer)0x0;
      bVar1 = equals(&local_170,(longlong *)&rr);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_170);
      }
      else {
        std::__cxx11::string::string((string *)&local_150,(string *)&b2);
        local_1b0._M_dataplus._M_p = (pointer)0x0;
        bVar1 = equals(&local_150,(longlong *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        if (!bVar1) {
          uVar8 = 0;
          std::__cxx11::to_string(&__return_storage_ptr__->_numberString,0);
          while( true ) {
            if (CONCAT44(b1._numberString._M_string_length._4_4_,
                         (int)b1._numberString._M_string_length) - b2._numberString._M_string_length
                <= uVar8) break;
            std::__cxx11::string::insert(&b2,b2._numberString._M_dataplus._M_p,0x30);
            uVar8 = (ulong)((int)uVar8 + 1);
          }
          uVar2 = 0;
          local_1f4 = 0;
          sVar7 = b2._numberString._M_string_length;
          while (sVar7 = sVar7 - 1, -1 < (long)sVar7) {
            rr._M_dataplus._M_p = (pointer)&rr.field_2;
            rr._M_string_length = 0;
            rr.field_2._M_local_buf[0] = '\0';
            lVar6 = (long)((int)b1._numberString._M_string_length + -1);
            while (-1 < lVar6) {
              __val = (b1._numberString._M_dataplus._M_p[lVar6] + -0x30) *
                      (b2._numberString._M_dataplus._M_p[sVar7] + -0x30) + uVar2;
              bVar1 = lVar6 == 0;
              lVar6 = lVar6 + -1;
              if ((bVar1) || ((int)__val < 10)) {
                std::__cxx11::to_string(&local_1b0,__val);
                std::__cxx11::string::insert((ulong)&rr,(string *)0x0);
                std::__cxx11::string::~string((string *)&local_1b0);
                uVar2 = 0;
              }
              else {
                uVar2 = __val / 10;
                std::__cxx11::to_string(&local_1b0,__val % 10);
                std::__cxx11::string::insert((ulong)&rr,(string *)0x0);
                std::__cxx11::string::~string((string *)&local_1b0);
              }
            }
            iVar5 = local_1f4;
            if (local_1f4 != 0) {
              while (bVar1 = iVar5 != 0, iVar5 = iVar5 + -1, bVar1) {
                std::__cxx11::string::append((char *)&rr);
              }
            }
            std::__cxx11::string::string(local_b0,(string *)&rr);
            std::__cxx11::string::string((string *)&local_1b0,local_b0);
            operator+=(__return_storage_ptr__,(BigNumber *)&local_1b0);
            local_1f4 = local_1f4 + 1;
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string(local_b0);
            std::__cxx11::string::~string((string *)&rr);
          }
          lVar6 = std::__cxx11::string::find_first_not_of((char)__return_storage_ptr__,0x30);
          if (lVar6 == -1) {
            std::__cxx11::string::string((string *)&rr,"0",(allocator *)&local_1b0);
            setString(&local_90,__return_storage_ptr__,&rr);
            psVar4 = (string *)&local_90;
            goto LAB_00103590;
          }
          std::__cxx11::string::find_first_not_of((char)__return_storage_ptr__,0x30);
          psVar3 = (string *)std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
          setString((BigNumber *)&local_70,__return_storage_ptr__,psVar3);
          psVar3 = &local_70;
          goto LAB_00103661;
        }
      }
      std::__cxx11::to_string(&__return_storage_ptr__->_numberString,0);
      goto LAB_00103666;
    }
    negate((BigNumber *)&local_1b0,&b2);
    std::__cxx11::string::string((string *)&local_130,(string *)&b1);
    multiply((BigNumber *)&rr,(BigNumber *)&local_1b0,&local_130);
    negate(__return_storage_ptr__,(BigNumber *)&rr);
    std::__cxx11::string::~string((string *)&rr);
    psVar4 = (string *)&local_130;
LAB_00103657:
    std::__cxx11::string::~string(psVar4);
    psVar3 = &local_1b0;
  }
LAB_00103661:
  std::__cxx11::string::~string((string *)psVar3);
LAB_00103666:
  std::__cxx11::string::~string((string *)&b2);
  std::__cxx11::string::~string((string *)&b1);
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::multiply(BigNumber other) {
    BigNumber b1 = other > *this ? other : *this;
    BigNumber b2 = other > *this ? *this : other;
    if (b1.isNegative() || b2.isNegative()) {
        if (b1.isNegative() && b2.isNegative()) {
            return b1.negate().multiply(b2.negate());
        }
        else if (b1.isNegative() && !b2.isNegative()) {
            return b1.negate().multiply(b2).negate();
        }
        else {
            return b2.negate().multiply(b1).negate();
        }
    }
    if (b1 == 0 || b2 == 0) return 0;
    int carry = 0;
    int zeroCounter = 0;
    BigNumber b = 0;
    
    for (unsigned int i = 0; i < b1._numberString.size() - b2._numberString.size(); ++i) {
        b2._numberString.insert(b2._numberString.begin(), '0');
    }
    for (long long int i = (b2._numberString.size() - 1); i >= 0; --i) {
        std::string rr;
        for (long long int j = int(b1._numberString.size() - 1); j >= 0; --j) {
            int val = ((b2._numberString[i] - '0') * (b1._numberString[j] - '0')) + carry;
            carry = 0;
            if (val > 9 && j != 0) {
                carry = val / 10;
                rr.insert(0, std::to_string(val % 10));
            }
            else {
                rr.insert(0, std::to_string(val));
            }
        }
        if (zeroCounter > 0) {
            for (int x = 0; x < zeroCounter; ++x) {
                rr.append("0");
            }
        }
        ++zeroCounter;
        b += BigNumber(rr);
    }
    if (b._numberString.find_first_not_of('0') != std::string::npos) {
        b.setString(b._numberString.erase(0, b._numberString.find_first_not_of('0')));
    }
    else {
        //In the case of all 0's, we only want to return one of them
        b.setString("0");
    }
    return b;
}